

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void leaveblock(FuncState *fs)

{
  BlockCnt *bl_00;
  LexState *ls_00;
  int list;
  int j;
  LexState *ls;
  BlockCnt *bl;
  FuncState *fs_local;
  
  bl_00 = fs->bl;
  ls_00 = fs->ls;
  if ((bl_00->previous != (BlockCnt *)0x0) && (bl_00->upval != '\0')) {
    list = luaK_jump(fs);
    luaK_patchclose(fs,list,(uint)bl_00->nactvar);
    luaK_patchtohere(fs,list);
  }
  if (bl_00->isloop != '\0') {
    breaklabel(ls_00);
  }
  fs->bl = bl_00->previous;
  removevars(fs,(uint)bl_00->nactvar);
  fs->freereg = fs->nactvar;
  (ls_00->dyd->label).n = bl_00->firstlabel;
  if (bl_00->previous == (BlockCnt *)0x0) {
    if (bl_00->firstgoto < (ls_00->dyd->gt).n) {
      undefgoto(ls_00,(ls_00->dyd->gt).arr + bl_00->firstgoto);
    }
  }
  else {
    movegotosout(fs,bl_00);
  }
  return;
}

Assistant:

static void leaveblock (FuncState *fs) {
  BlockCnt *bl = fs->bl;
  LexState *ls = fs->ls;
  if (bl->previous && bl->upval) {
    /* create a 'jump to here' to close upvalues */
    int j = luaK_jump(fs);
    luaK_patchclose(fs, j, bl->nactvar);
    luaK_patchtohere(fs, j);
  }
  if (bl->isloop)
    breaklabel(ls);  /* close pending breaks */
  fs->bl = bl->previous;
  removevars(fs, bl->nactvar);
  lua_assert(bl->nactvar == fs->nactvar);
  fs->freereg = fs->nactvar;  /* free registers */
  ls->dyd->label.n = bl->firstlabel;  /* remove local labels */
  if (bl->previous)  /* inner block? */
    movegotosout(fs, bl);  /* update pending gotos to outer block */
  else if (bl->firstgoto < ls->dyd->gt.n)  /* pending gotos in outer block? */
    undefgoto(ls, &ls->dyd->gt.arr[bl->firstgoto]);  /* error */
}